

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_intrusive_list.cpp
# Opt level: O0

void __thiscall IntrusiveList_OneElement_Test::TestBody(IntrusiveList_OneElement_Test *this)

{
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  bool bVar1;
  value *pvVar2;
  char *pcVar3;
  AssertHelper local_130;
  Message local_128;
  iterator local_120;
  iterator local_118;
  undefined1 local_110 [8];
  AssertionResult gtest_ar_3;
  Message local_f8;
  value *local_f0;
  iterator local_e8;
  difference_type local_e0;
  int local_d4;
  undefined1 local_d0 [8];
  AssertionResult gtest_ar_2;
  Message local_b8;
  int local_ac;
  iterator local_a8;
  undefined1 local_a0 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_88;
  Message local_80;
  value *local_78;
  iterator local_60;
  difference_type local_58;
  int local_4c;
  undefined1 local_48 [8];
  AssertionResult gtest_ar;
  intrusive_list<(anonymous_namespace)::value> v;
  value member;
  IntrusiveList_OneElement_Test *this_local;
  
  anon_unknown.dwarf_647ac::value::value((value *)&v.tail_,0x2f);
  this_00 = &gtest_ar.message_;
  pstore::broker::intrusive_list<(anonymous_namespace)::value>::intrusive_list
            ((intrusive_list<(anonymous_namespace)::value> *)this_00);
  pvVar2 = pstore::broker::intrusive_list<(anonymous_namespace)::value>::tail
                     ((intrusive_list<(anonymous_namespace)::value> *)this_00);
  pstore::broker::intrusive_list<(anonymous_namespace)::value>::insert_before
            ((intrusive_list<(anonymous_namespace)::value> *)this_00,(value *)&v.tail_,pvVar2);
  local_4c = 1;
  local_60 = pstore::broker::intrusive_list<(anonymous_namespace)::value>::begin
                       ((intrusive_list<(anonymous_namespace)::value> *)this_00);
  local_78 = (value *)pstore::broker::intrusive_list<(anonymous_namespace)::value>::end
                                ((intrusive_list<(anonymous_namespace)::value> *)&gtest_ar.message_)
  ;
  local_58 = std::distance<pstore::broker::intrusive_list<(anonymous_namespace)::value>::iterator>
                       (local_60,(iterator)local_78);
  testing::internal::EqHelper::Compare<int,_long,_nullptr>
            ((EqHelper *)local_48,"1","std::distance (v.begin (), v.end ())",&local_4c,&local_58);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_48);
  if (!bVar1) {
    testing::Message::Message(&local_80);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_48);
    testing::internal::AssertHelper::AssertHelper
              (&local_88,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/broker/test_intrusive_list.cpp"
               ,0x2b,pcVar3);
    testing::internal::AssertHelper::operator=(&local_88,&local_80);
    testing::internal::AssertHelper::~AssertHelper(&local_88);
    testing::Message::~Message(&local_80);
  }
  gtest_ar_1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._5_3_ = 0;
  gtest_ar_1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._4_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_48);
  if (gtest_ar_1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_4_ == 0) {
    local_a8 = pstore::broker::intrusive_list<(anonymous_namespace)::value>::begin
                         ((intrusive_list<(anonymous_namespace)::value> *)&gtest_ar.message_);
    pvVar2 = pstore::broker::intrusive_list<(anonymous_namespace)::value>::iterator::operator->
                       (&local_a8);
    local_ac = 0x2f;
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              ((EqHelper *)local_a0,"v.begin ()->v","47",&pvVar2->v,&local_ac);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a0);
    if (!bVar1) {
      testing::Message::Message(&local_b8);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_a0);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/broker/test_intrusive_list.cpp"
                 ,0x2c,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_b8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
      testing::Message::~Message(&local_b8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_a0);
    pstore::broker::intrusive_list<(anonymous_namespace)::value>::erase((value *)&v.tail_);
    local_d4 = 0;
    local_e8 = pstore::broker::intrusive_list<(anonymous_namespace)::value>::begin
                         ((intrusive_list<(anonymous_namespace)::value> *)&gtest_ar.message_);
    local_f0 = (value *)pstore::broker::intrusive_list<(anonymous_namespace)::value>::end
                                  ((intrusive_list<(anonymous_namespace)::value> *)
                                   &gtest_ar.message_);
    local_e0 = std::distance<pstore::broker::intrusive_list<(anonymous_namespace)::value>::iterator>
                         (local_e8,(iterator)local_f0);
    testing::internal::EqHelper::Compare<int,_long,_nullptr>
              ((EqHelper *)local_d0,"0","std::distance (v.begin (), v.end ())",&local_d4,&local_e0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d0);
    if (!bVar1) {
      testing::Message::Message(&local_f8);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_d0);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/broker/test_intrusive_list.cpp"
                 ,0x2f,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_f8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
      testing::Message::~Message(&local_f8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_d0);
    local_118 = pstore::broker::intrusive_list<(anonymous_namespace)::value>::begin
                          ((intrusive_list<(anonymous_namespace)::value> *)&gtest_ar.message_);
    local_120 = pstore::broker::intrusive_list<(anonymous_namespace)::value>::end
                          ((intrusive_list<(anonymous_namespace)::value> *)&gtest_ar.message_);
    testing::internal::EqHelper::
    Compare<pstore::broker::intrusive_list<(anonymous_namespace)::value>::iterator,_pstore::broker::intrusive_list<(anonymous_namespace)::value>::iterator,_nullptr>
              ((EqHelper *)local_110,"v.begin ()","v.end ()",&local_118,&local_120);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_110);
    if (!bVar1) {
      testing::Message::Message(&local_128);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_110);
      testing::internal::AssertHelper::AssertHelper
                (&local_130,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/broker/test_intrusive_list.cpp"
                 ,0x30,pcVar3);
      testing::internal::AssertHelper::operator=(&local_130,&local_128);
      testing::internal::AssertHelper::~AssertHelper(&local_130);
      testing::Message::~Message(&local_128);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_110);
    gtest_ar_1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._4_4_ = 0;
  }
  pstore::broker::intrusive_list<(anonymous_namespace)::value>::~intrusive_list
            ((intrusive_list<(anonymous_namespace)::value> *)&gtest_ar.message_);
  return;
}

Assistant:

TEST (IntrusiveList, OneElement) {
    value member{47};

    pstore::broker::intrusive_list<value> v;
    v.insert_before (&member, v.tail ());

    ASSERT_EQ (1, std::distance (v.begin (), v.end ()));
    EXPECT_EQ (v.begin ()->v, 47);

    v.erase (&member);
    EXPECT_EQ (0, std::distance (v.begin (), v.end ()));
    EXPECT_EQ (v.begin (), v.end ());
}